

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void gen_load_exclusive(DisasContext_conflict1 *s,int rt,int rt2,TCGv_i64 addr,int size,
                       _Bool is_pair)

{
  MemOp MVar1;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i64 pTVar2;
  TCGv_i64 pTVar3;
  uintptr_t o;
  uint ofs;
  ulong idx;
  
  if (3 < size) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
               ,0x94c,"size <= 3");
  }
  tcg_ctx = s->uc->tcg_ctx;
  MVar1 = s->be_data;
  idx = (ulong)(s->mmu_idx & 0xf);
  if (is_pair) {
    if (size < 2) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                 ,0x94e,"size >= 2");
    }
    if (size == 2) {
      tcg_gen_qemu_ld_i64_aarch64
                (tcg_ctx,tcg_ctx->cpu_exclusive_val,addr,idx,MVar1 | (MO_ALIGN|MO_64));
      MVar1 = s->be_data;
      pTVar2 = cpu_reg_aarch64(s,rt);
      ofs = 0x20;
      if (MVar1 == MO_8) {
        tcg_gen_extract_i64_aarch64(tcg_ctx,pTVar2,tcg_ctx->cpu_exclusive_val,0,0x20);
        pTVar3 = cpu_reg_aarch64(s,rt2);
        pTVar2 = tcg_ctx->cpu_exclusive_val;
      }
      else {
        tcg_gen_extract_i64_aarch64(tcg_ctx,pTVar2,tcg_ctx->cpu_exclusive_val,0x20,0x20);
        pTVar3 = cpu_reg_aarch64(s,rt2);
        pTVar2 = tcg_ctx->cpu_exclusive_val;
        ofs = 0;
      }
      tcg_gen_extract_i64_aarch64(tcg_ctx,pTVar3,pTVar2,ofs,0x20);
      goto LAB_0062f1d5;
    }
    tcg_gen_qemu_ld_i64_aarch64
              (tcg_ctx,tcg_ctx->cpu_exclusive_val,addr,idx,MVar1 | (MO_ALIGN_16|MO_64));
    pTVar2 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_addi_i64_aarch64(tcg_ctx,pTVar2,addr,8);
    tcg_gen_qemu_ld_i64_aarch64(tcg_ctx,tcg_ctx->cpu_exclusive_high,pTVar2,idx,MVar1 | MO_64);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    pTVar2 = cpu_reg_aarch64(s,rt);
    tcg_gen_mov_i64_aarch64(tcg_ctx,pTVar2,tcg_ctx->cpu_exclusive_val);
    pTVar3 = cpu_reg_aarch64(s,rt2);
    pTVar2 = tcg_ctx->cpu_exclusive_high;
  }
  else {
    tcg_gen_qemu_ld_i64_aarch64(tcg_ctx,tcg_ctx->cpu_exclusive_val,addr,idx,MVar1 | size | MO_ALIGN)
    ;
    pTVar3 = cpu_reg_aarch64(s,rt);
    pTVar2 = tcg_ctx->cpu_exclusive_val;
  }
  tcg_gen_mov_i64_aarch64(tcg_ctx,pTVar3,pTVar2);
LAB_0062f1d5:
  tcg_gen_mov_i64_aarch64(tcg_ctx,tcg_ctx->cpu_exclusive_addr,addr);
  return;
}

Assistant:

static void gen_load_exclusive(DisasContext *s, int rt, int rt2,
                               TCGv_i64 addr, int size, bool is_pair)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int idx = get_mem_index(s);
    MemOp memop = s->be_data;

    g_assert(size <= 3);
    if (is_pair) {
        g_assert(size >= 2);
        if (size == 2) {
            /* The pair must be single-copy atomic for the doubleword.  */
            memop |= MO_64 | MO_ALIGN;
            tcg_gen_qemu_ld_i64(tcg_ctx, tcg_ctx->cpu_exclusive_val, addr, idx, memop);
            if (s->be_data == MO_LE) {
                tcg_gen_extract_i64(tcg_ctx, cpu_reg(s, rt), tcg_ctx->cpu_exclusive_val, 0, 32);
                tcg_gen_extract_i64(tcg_ctx, cpu_reg(s, rt2), tcg_ctx->cpu_exclusive_val, 32, 32);
            } else {
                tcg_gen_extract_i64(tcg_ctx, cpu_reg(s, rt), tcg_ctx->cpu_exclusive_val, 32, 32);
                tcg_gen_extract_i64(tcg_ctx, cpu_reg(s, rt2), tcg_ctx->cpu_exclusive_val, 0, 32);
            }
        } else {
            /* The pair must be single-copy atomic for *each* doubleword, not
               the entire quadword, however it must be quadword aligned.  */
            memop |= MO_64;
            tcg_gen_qemu_ld_i64(tcg_ctx, tcg_ctx->cpu_exclusive_val, addr, idx,
                                memop | MO_ALIGN_16);

            TCGv_i64 addr2 = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_addi_i64(tcg_ctx, addr2, addr, 8);
            tcg_gen_qemu_ld_i64(tcg_ctx, tcg_ctx->cpu_exclusive_high, addr2, idx, memop);
            tcg_temp_free_i64(tcg_ctx, addr2);

            tcg_gen_mov_i64(tcg_ctx, cpu_reg(s, rt), tcg_ctx->cpu_exclusive_val);
            tcg_gen_mov_i64(tcg_ctx, cpu_reg(s, rt2), tcg_ctx->cpu_exclusive_high);
        }
    } else {
        memop |= size | MO_ALIGN;
        tcg_gen_qemu_ld_i64(tcg_ctx, tcg_ctx->cpu_exclusive_val, addr, idx, memop);
        tcg_gen_mov_i64(tcg_ctx, cpu_reg(s, rt), tcg_ctx->cpu_exclusive_val);
    }
    tcg_gen_mov_i64(tcg_ctx, tcg_ctx->cpu_exclusive_addr, addr);
}